

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O1

void Rwr_ScoresReport(Rwr_Man_t *p)

{
  unsigned_short uVar1;
  uint uVar2;
  void *pvVar3;
  Rwr_Man_t *pRVar4;
  Vec_Vec_t *pVVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uTruth;
  int Perm [222];
  uint local_3b4;
  Rwr_Man_t *local_3b0;
  uint local_3a8 [222];
  
  pVVar5 = p->vClasses;
  if (pVVar5->nSize != 0xde) {
    __assert_fail("p->vClasses->nSize == 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                  ,0x22f,"void Rwr_ScoresReport(Rwr_Man_t *)");
  }
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      local_3a8[lVar6] = (uint)lVar6;
      Gains[lVar6] = 0;
      if (pVVar5->nSize <= lVar6) goto LAB_00441f10;
      lVar7 = (long)*(int *)((long)pVVar5->pArray[lVar6] + 4);
      if (0 < lVar7) {
        iVar9 = Gains[lVar6];
        lVar10 = 0;
        do {
          iVar9 = iVar9 + *(short *)(*(long *)(*(long *)((long)pVVar5->pArray[lVar6] + 8) +
                                              lVar10 * 8) + 10);
          lVar10 = lVar10 + 1;
        } while (lVar7 != lVar10);
        Gains[lVar6] = iVar9;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar5->nSize);
  }
  qsort(local_3a8,0xde,4,Rwr_ScoresCompare);
  pVVar5 = p->vClasses;
  uVar8 = (ulong)(uint)pVVar5->nSize;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    local_3b0 = p;
    do {
      pRVar4 = local_3b0;
      uVar2 = local_3a8[lVar6];
      if (Gains[(int)uVar2] == 0) {
        return;
      }
      if (((int)uVar2 < 0) || ((int)uVar8 <= (int)uVar2)) {
LAB_00441f10:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar3 = pVVar5->pArray[(int)uVar2];
      printf("CLASS %3d: Subgr = %3d. Total gain = %6d.  ",(ulong)uVar2,
             (ulong)*(uint *)((long)pvVar3 + 4));
      local_3b4 = (uint)pRVar4->pMapInv[(int)uVar2];
      Extra_PrintBinary(_stdout,&local_3b4,0x10);
      printf("  ");
      uVar1 = pRVar4->pMapInv[(int)uVar2];
      Ivy_TruthDsdComputePrint(CONCAT22(uVar1,uVar1));
      if (0 < *(int *)((long)pvVar3 + 4)) {
        uVar8 = 0;
        do {
          lVar7 = *(long *)(*(long *)((long)pvVar3 + 8) + uVar8 * 8);
          if ((int)*(short *)(lVar7 + 8) != 0) {
            printf("    %2d: S=%5d. A=%5d. G=%6d. ",uVar8 & 0xffffffff,
                   (ulong)(uint)(int)*(short *)(lVar7 + 8),(ulong)(uint)(int)*(short *)(lVar7 + 0xc)
                   ,(ulong)(uint)(int)*(short *)(lVar7 + 10));
            Dec_GraphPrint(_stdout,*(Dec_Graph_t **)(lVar7 + 0x28),(char **)0x0,(char *)0x0);
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)*(int *)((long)pvVar3 + 4));
      }
      lVar6 = lVar6 + 1;
      pVVar5 = local_3b0->vClasses;
      uVar8 = (ulong)pVVar5->nSize;
    } while (lVar6 < (long)uVar8);
  }
  return;
}

Assistant:

void Rwr_ScoresReport( Rwr_Man_t * p )
{
    extern void Ivy_TruthDsdComputePrint( unsigned uTruth );
    int Perm[222];
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, iNew, k;
    unsigned uTruth;
    // collect total gains
    assert( p->vClasses->nSize == 222 );
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        Perm[i] = i;
        Gains[i] = 0;
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            Gains[i] += pNode->nGain;
    }
    // sort the gains
    qsort( Perm, 222, sizeof(int), (int (*)(const void *, const void *))Rwr_ScoresCompare );

    // print classes
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        iNew = Perm[i];
        if ( Gains[iNew] == 0 )
            break;
        vSubgraphs = Vec_VecEntry( p->vClasses, iNew );
        printf( "CLASS %3d: Subgr = %3d. Total gain = %6d.  ", iNew, Vec_PtrSize(vSubgraphs), Gains[iNew] );
        uTruth = (unsigned)p->pMapInv[iNew];
        Extra_PrintBinary( stdout, &uTruth, 16 );
        printf( "  " );
        Ivy_TruthDsdComputePrint( (unsigned)p->pMapInv[iNew] | ((unsigned)p->pMapInv[iNew] << 16) );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
        {
            if ( pNode->nScore == 0 )
                continue;
            printf( "    %2d: S=%5d. A=%5d. G=%6d. ", k, pNode->nScore, pNode->nAdded, pNode->nGain );
            Dec_GraphPrint( stdout, (Dec_Graph_t *)pNode->pNext, NULL, NULL );
        }
    }
}